

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

void __thiscall
Js::TypedArrayBase::SetObject
          (TypedArrayBase *this,RecyclableObject *source,uint32 targetLength,uint32 offset)

{
  undefined8 uVar1;
  uint32 uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 local_40;
  Var itemValue;
  
  itemValue = (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
  uVar2 = GetSourceLength(this,source,targetLength,offset);
  if (uVar2 != 0) {
    uVar1 = *(undefined8 *)(*(long *)((long)itemValue + 8) + 0x430);
    uVar5 = 0;
    do {
      iVar3 = (*(source->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x26])(source,source,uVar5,&local_40,itemValue);
      if (iVar3 != 1) {
        local_40 = uVar1;
      }
      (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.super_RecyclableObject
        .super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
                (this,(ulong)(offset + (int)uVar5),local_40);
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while (uVar2 != uVar4);
  }
  return;
}

Assistant:

void TypedArrayBase::SetObject(RecyclableObject* source, uint32 targetLength, uint32 offset)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 sourceLength = GetSourceLength(source, targetLength, offset);

        Var itemValue;
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        for (uint32 i = 0; i < sourceLength; i ++)
        {
            if (!source->GetItem(source, i, &itemValue, scriptContext))
            {
                itemValue = undefinedValue;
            }
            DirectSetItem(offset + i, itemValue);
        }
    }